

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Build_Map.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Build_Map::Build_Node
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Build_Map *this,
          vector<double,_std::allocator<double>_> *Discrete)

{
  double *pdVar1;
  double *pdVar2;
  initializer_list<int> __l;
  int local_20;
  int local_1c;
  int local_18;
  allocator_type local_11;
  
  pdVar1 = (Discrete->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->Boundary).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_20 = (int)((*pdVar1 - *pdVar2) / this->xy_res);
  local_1c = (int)((pdVar1[1] - pdVar2[1]) / this->xy_res);
  local_18 = (int)((pdVar1[2] - pdVar2[2]) / this->z_res);
  __l._M_len = 3;
  __l._M_array = &local_20;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_11);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Build_Map::Build_Node(std::vector<double> Discrete) {
  int X_Init = (Discrete[0] - Boundary[0]) / xy_res;
  int Y_Init = (Discrete[1] - Boundary[1]) / xy_res;
  int Z_Init = (Discrete[2] - Boundary[2]) / z_res;
  std::vector<int> Built_Node = { X_Init, Y_Init, Z_Init };
  return Built_Node;
}